

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_parser.c
# Opt level: O2

RK_S32 mpp_hevc_extract_rbsp(HEVCContext *s,RK_U8 *src,int length,HEVCNAL *nal)

{
  RK_U8 RVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  RK_U8 *pRVar7;
  
  s->skipped_bytes = 0;
  for (iVar4 = 0; iVar3 = length, iVar4 + 1 < length; iVar4 = iVar4 + 5) {
    uVar2 = *(uint *)(src + iVar4);
    if ((~(0x1000100 - uVar2 | uVar2) & 0x80008080) != 0) {
      uVar6 = (long)iVar4;
      if (0 < iVar4) {
        uVar6 = (ulong)(iVar4 - (uint)((char)uVar2 == '\0'));
      }
      pRVar7 = src + uVar6;
      iVar3 = (int)uVar6 + -1;
      do {
        iVar4 = iVar3;
        iVar3 = iVar4 + 1;
        RVar1 = *pRVar7;
        pRVar7 = pRVar7 + 1;
      } while (RVar1 != '\0');
      if (((iVar4 + 3 < length) && (*pRVar7 == '\0')) && (src[iVar4 + 3] < 2)) break;
      iVar4 = iVar4 + -2;
    }
  }
  iVar4 = iVar3 + 8;
  pRVar7 = nal->rbsp_buffer;
  if (nal->rbsp_buffer_size < iVar4) {
    mpp_osal_free("mpp_hevc_extract_rbsp",pRVar7);
    nal->rbsp_buffer = (RK_U8 *)0x0;
    iVar5 = (iVar4 * 0x11) / 0x10 + 0x20;
    if (iVar5 <= iVar4) {
      iVar5 = iVar4;
    }
    pRVar7 = (RK_U8 *)mpp_osal_malloc("mpp_hevc_extract_rbsp",(long)iVar5);
    nal->rbsp_buffer = pRVar7;
    if (pRVar7 == (RK_U8 *)0x0) {
      iVar5 = 0;
    }
    nal->rbsp_buffer_size = iVar5;
  }
  memcpy(pRVar7,src,(long)iVar3);
  nal->data = nal->rbsp_buffer;
  nal->size = iVar3;
  pRVar7 = nal->rbsp_buffer + iVar3;
  pRVar7[0] = '\0';
  pRVar7[1] = '\0';
  pRVar7[2] = '\0';
  pRVar7[3] = '\0';
  pRVar7[4] = '\0';
  pRVar7[5] = '\0';
  pRVar7[6] = '\0';
  pRVar7[7] = '\0';
  return iVar3;
}

Assistant:

RK_S32 mpp_hevc_extract_rbsp(HEVCContext *s, const RK_U8 *src, int length,
                             HEVCNAL *nal)
{
    RK_S32 i;

    s->skipped_bytes = 0;

#define STARTCODE_TEST                                              \
    if (i + 2 < length && src[i + 1] == 0 && src[i + 2] < 2) {      \
            /* startcode, so we must be past the end */             \
        length = i;                                                 \
        break;                                                      \
    }